

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

string * __thiscall
pbrt::ParameterDictionary::ToParameterDefinition_abi_cxx11_
          (string *__return_storage_ptr__,ParameterDictionary *this,ParsedParameter *p,
          int indentCount)

{
  double dVar1;
  ParsedParameter **ppPVar2;
  RGBColorSpace *pRVar3;
  ParsedParameter *pPVar4;
  bool bVar5;
  ParsedParameter *pPVar6;
  ParsedParameter *pPVar7;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long lVar8;
  int column;
  int continuationIndent;
  string local_88;
  anon_class_24_3_c9cfb6fb printOne;
  float local_50 [8];
  
  StringPrintf<std::__cxx11::string_const&,std::__cxx11::string_const&>
            (__return_storage_ptr__,(pbrt *)"\"%s %s\" [ ",(char *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&(this->params).field_2 + 0x10),in_R8);
  printOne.column = &column;
  continuationIndent =
       *(int *)((long)&(this->params).field_2 + 0x18) + 10 + (int)p + *(int *)&(this->params).ptr;
  printOne.continuationIndent = &continuationIndent;
  column = (int)p + 4 + (int)__return_storage_ptr__->_M_string_length;
  ppPVar2 = this[1].params.ptr;
  pRVar3 = this->colorSpace;
  printOne.s = __return_storage_ptr__;
  for (lVar8 = 0; (long)ppPVar2 << 3 != lVar8; lVar8 = lVar8 + 8) {
    dVar1 = *(double *)
             ((long)&(((RGBColorSpace *)(&pRVar3->XYZFromRGB + -2))->r).
                     super_Tuple2<pbrt::Point2,_float>.x + lVar8);
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this,"integer");
    if (bVar5) {
      local_50[0] = (float)(int)dVar1;
      StringPrintf<int>(&local_88,"%d ",(int *)local_50);
      ToParameterDefinition::anon_class_24_3_c9cfb6fb::operator()(&printOne,&local_88);
    }
    else {
      local_50[0] = (float)dVar1;
      StringPrintf<float>(&local_88,"%f ",local_50);
      ToParameterDefinition::anon_class_24_3_c9cfb6fb::operator()(&printOne,&local_88);
    }
    std::__cxx11::string::~string((string *)&local_88);
  }
  pPVar6 = this[1].params.field_2.fixed[1];
  for (lVar8 = (long)this[1].params.field_2.fixed[3] << 5; lVar8 != 0; lVar8 = lVar8 + -0x20) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   '\"',&pPVar6->type);
    std::operator+(&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "\" ");
    ToParameterDefinition::anon_class_24_3_c9cfb6fb::operator()(&printOne,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)local_50);
    pPVar6 = (ParsedParameter *)&pPVar6->name;
  }
  pPVar6 = this[1].params.field_2.fixed[5];
  pPVar4 = this[1].params.field_2.fixed[7];
  for (pPVar7 = (ParsedParameter *)0x0; pPVar4 != pPVar7;
      pPVar7 = (ParsedParameter *)((long)&(pPVar7->type)._M_dataplus._M_p + 1)) {
    __s = "false ";
    if (*(char *)((long)&(pPVar7->type)._M_dataplus._M_p + (long)&(pPVar6->type)._M_dataplus._M_p)
        != '\0') {
      __s = "true ";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,__s,(allocator<char> *)local_50);
    ToParameterDefinition::anon_class_24_3_c9cfb6fb::operator()(&printOne,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ParameterDictionary::ToParameterDefinition(const ParsedParameter *p,
                                                       int indentCount) {
    std::string s = StringPrintf("\"%s %s\" [ ", p->type, p->name);
    int continuationIndent = indentCount + 10 + p->type.size() + p->name.size();
    int column = indentCount + 4 + s.size();
    auto printOne = [&](const std::string &val) {
        if (column > 80) {  //   && i % 3 == 0) {
            s += "\n";
            s.append(continuationIndent, ' ');
            column = continuationIndent;
        }
        column += val.size();
        s += val;
    };

    for (double v : p->numbers)
        if (p->type == ParameterTypeTraits<ParameterType::Integer>::typeName)
            printOne(StringPrintf("%d ", int(v)));
        else
            printOne(StringPrintf("%f ", Float(v)));
    for (const auto &str : p->strings)
        printOne('"' + str + "\" ");
    for (bool b : p->bools)
        printOne(b ? "true " : "false ");
    s += "]";

    return s;
}